

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O2

TValue * cpwriter(lua_State *L,lua_CFunction dummy,void *ud)

{
  uint v;
  uint uVar1;
  undefined4 uVar2;
  ulong in_RAX;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  undefined8 uStack_28;
  
  uVar1 = *(uint *)((long)ud + 8);
  uVar3 = *(int *)((long)ud + 4) - uVar1;
  uStack_28 = in_RAX;
  if (uVar3 < 0x400) {
    lj_buf_need2((SBuf *)ud,0x400);
    uVar1 = *(uint *)((long)ud + 8);
    uVar3 = *(int *)((long)ud + 4) - uVar1;
  }
  uVar4 = (ulong)*(uint *)(*(long *)((long)ud + 0x10) + 0x28);
  v = *(uint *)(uVar4 + 0xc);
  if (uVar3 < v + 10) {
    pcVar5 = lj_buf_need2((SBuf *)ud,v + 10);
  }
  else {
    pcVar5 = (char *)(ulong)uVar1;
  }
  pcVar5[0] = '\x1b';
  pcVar5[1] = 'L';
  pcVar5[2] = 'J';
  pcVar5[3] = '\x02';
  pcVar5[4] = *(byte *)(*(long *)((long)ud + 0x10) + 0x25) & 4 |
              (*(int *)((long)ud + 0x28) != 0) * '\x02';
  pcVar5 = pcVar5 + 5;
  if (*(int *)((long)ud + 0x28) == 0) {
    pcVar5 = lj_strfmt_wuleb128(pcVar5,v);
    memcpy(pcVar5,(void *)(uVar4 + 0x10),(ulong)v);
    pcVar5 = pcVar5 + v;
  }
  uVar2 = (**(code **)((long)ud + 0x18))
                    (*(undefined4 *)((long)ud + 0xc),*(int *)((long)ud + 8),
                     (int)pcVar5 - *(int *)((long)ud + 8),*(undefined8 *)((long)ud + 0x20));
  *(undefined4 *)((long)ud + 0x2c) = uVar2;
  bcwrite_proto((BCWriteCtx *)ud,*(GCproto **)((long)ud + 0x10));
  if (*(int *)((long)ud + 0x2c) == 0) {
    uStack_28 = uStack_28 & 0xffffffffffffff;
    uVar2 = (**(code **)((long)ud + 0x18))
                      (*(undefined4 *)((long)ud + 0xc),(long)&uStack_28 + 7,1,
                       *(undefined8 *)((long)ud + 0x20));
    *(undefined4 *)((long)ud + 0x2c) = uVar2;
  }
  return (TValue *)0x0;
}

Assistant:

static TValue *cpwriter(lua_State *L, lua_CFunction dummy, void *ud)
{
  BCWriteCtx *ctx = (BCWriteCtx *)ud;
  UNUSED(L); UNUSED(dummy);
  lj_buf_need(&ctx->sb, 1024);  /* Avoids resize for most prototypes. */
  bcwrite_header(ctx);
  bcwrite_proto(ctx, ctx->pt);
  bcwrite_footer(ctx);
  return NULL;
}